

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codacheck.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  int *piVar6;
  undefined4 uVar7;
  ulong uVar8;
  bool bVar9;
  char filename [1000];
  char local_418 [1000];
  
  option_verbose = 0;
  option_quick = 0;
  option_require_definition = 0;
  if (argc != 1) {
    pcVar2 = argv[1];
    cVar1 = *pcVar2;
    if (cVar1 == '-') {
      if (((pcVar2[1] != 'h') || (pcVar2[2] != '\0')) &&
         (iVar3 = strcmp(pcVar2,"--help"), iVar3 != 0)) {
        if ((pcVar2[1] != 'v') || (pcVar2[2] != '\0')) goto LAB_00101400;
        goto LAB_00101729;
      }
    }
    else {
      iVar3 = strcmp(pcVar2,"--help");
      if (iVar3 != 0) {
LAB_00101400:
        iVar3 = strcmp(pcVar2,"--version");
        if (iVar3 != 0) {
          if (((argc < 3 || cVar1 != '-') || (pcVar2[1] != 'D')) || (pcVar2[2] != '\0')) {
            iVar3 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
            uVar8 = 1;
            if (iVar3 != 0) {
              main_cold_1();
LAB_00101749:
              main_cold_2();
              puts("Usage:");
              puts("    codacheck [-D definitionpath] [<options>] <files>");
              puts("        Provide a basic sanity check on product files supported by CODA");
              puts("        Options:");
              puts("            -d, --definition");
              puts("                    require products to have a definition in a codadef file,");
              puts("                    return an error and abort verification otherwise");
              puts("                    (affects products using formats such as xml/netcdf/hdf)");
              puts("            -q, --quick");
              puts("                    only perform a quick check of the product");
              puts("                    (do not traverse the full product)");
              puts("            -V, --verbose");
              puts("                    show more information while performing the check");
              puts("            --no-mmap");
              puts("                    disable the use of mmap when opening files");
              putchar(10);
              puts("        If you pass a \'-\' for the <files> section then the list of files will"
                  );
              puts("        be read from stdin.");
              putchar(10);
              puts("    codacheck -h, --help");
              puts("        Show help (this text)");
              putchar(10);
              puts("    codacheck -v, --version");
              puts("        Print the version number of CODA and exit");
              putchar(10);
              puts("    CODA will look for .codadef files using a definition path, which is a \':\'"
                  );
              puts("    separated (\';\' on Windows) list of paths to .codadef files and/or to");
              puts("    directories containing .codadef files.");
              puts("    By default the definition path is set to a single directory relative to");
              puts("    the tool location. A different definition path can be set via the");
              puts("    CODA_DEFINITION environment variable or via the -D option.");
              puts("    (the -D option overrides the environment variable setting).");
              iVar3 = putchar(10);
              return iVar3;
            }
          }
          else {
            coda_set_definition_path(argv[2]);
            uVar8 = 3;
          }
          bVar9 = true;
          uVar7 = 1;
          if ((int)uVar8 < argc) {
            do {
              pcVar2 = argv[uVar8];
              cVar1 = *pcVar2;
              if (cVar1 == '-') {
                if ((pcVar2[1] != 'V') || (piVar6 = &option_verbose, pcVar2[2] != '\0')) {
                  iVar3 = strcmp(pcVar2,"--verbose");
                  piVar6 = &option_verbose;
                  if (iVar3 != 0) {
                    if (pcVar2[1] == 'q') {
                      piVar6 = &option_quick;
                      if (pcVar2[2] == '\0') goto LAB_0010159c;
                      iVar3 = strcmp(pcVar2,"--quick");
                    }
                    else {
                      iVar3 = strcmp(pcVar2,"--quick");
                    }
                    piVar6 = &option_quick;
                    if ((iVar3 != 0) &&
                       ((pcVar2[1] != 'd' ||
                        (piVar6 = &option_require_definition, pcVar2[2] != '\0'))))
                    goto LAB_00101533;
                  }
                }
LAB_0010159c:
                *piVar6 = 1;
                uVar4 = uVar7;
              }
              else {
                iVar3 = strcmp(pcVar2,"--verbose");
                piVar6 = &option_verbose;
                if (iVar3 == 0) goto LAB_0010159c;
                iVar3 = strcmp(pcVar2,"--quick");
                piVar6 = &option_quick;
                if (iVar3 == 0) goto LAB_0010159c;
LAB_00101533:
                iVar3 = strcmp(pcVar2,"--definition");
                piVar6 = &option_require_definition;
                if (iVar3 == 0) goto LAB_0010159c;
                iVar3 = strcmp(pcVar2,"--no-mmap");
                uVar4 = 0;
                if (iVar3 != 0) {
                  if (cVar1 != '-') goto LAB_001015b7;
                  if ((pcVar2[1] != '\0') || (argc + -1 != (int)uVar8)) goto LAB_00101749;
                  bVar9 = false;
                  goto LAB_001015bf;
                }
              }
              uVar8 = uVar8 + 1;
              uVar7 = uVar4;
            } while ((uint)argc != uVar8);
            uVar8 = (ulong)(uint)argc;
LAB_001015b7:
            bVar9 = true;
          }
LAB_001015bf:
          iVar3 = coda_init();
          if (iVar3 == 0) {
            coda_set_option_perform_boundary_checks(0);
            coda_set_option_perform_conversions(0);
            coda_set_option_use_mmap(uVar7);
            if (bVar9) {
              if ((int)uVar8 < argc) {
                uVar8 = uVar8 & 0xffffffff;
                do {
                  check_file(argv[uVar8]);
                  fflush((FILE *)0x0);
                  uVar8 = uVar8 + 1;
                } while ((uint)argc != uVar8);
              }
            }
            else {
              uVar8 = 0;
LAB_0010163b:
              do {
                iVar3 = getchar();
                iVar5 = iVar3 << 0x18;
                if ((iVar5 == -0x1000000) || (iVar5 == 0xa000000)) {
                  bVar9 = iVar5 == -0x1000000;
                }
                else {
                  if (iVar5 != 0xd000000) {
                    local_418[uVar8] = (char)iVar3;
                    uVar8 = uVar8 + 1;
                    if (uVar8 == 1000) {
                      __assert_fail("k < 1000",
                                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codacheck/codacheck.c"
                                    ,0x139,"int main(int, char **)");
                    }
                    goto LAB_0010163b;
                  }
                  iVar3 = getchar();
                  if (iVar3 << 0x18 != 0xa000000) {
                    ungetc((iVar3 << 0x18) >> 0x18,_stdin);
                  }
                  bVar9 = false;
                }
                local_418[uVar8 & 0xffffffff] = '\0';
                if (uVar8 != 0) {
                  check_file(local_418);
                  fflush((FILE *)0x0);
                }
                uVar8 = 0;
              } while (!bVar9);
            }
            coda_done();
            if (found_errors == 0) {
              return 0;
            }
          }
          else {
            main_cold_3();
          }
          exit(1);
        }
LAB_00101729:
        print_version();
        goto LAB_0010172e;
      }
    }
  }
  print_help();
LAB_0010172e:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    int option_stdin;
    int option_use_mmap;
    int i;

    option_stdin = 0;
    option_verbose = 0;
    option_quick = 0;
    option_use_mmap = 1;
    option_require_definition = 0;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-V") == 0 || strcmp(argv[i], "--verbose") == 0)
        {
            option_verbose = 1;
        }
        else if (strcmp(argv[i], "-q") == 0 || strcmp(argv[i], "--quick") == 0)
        {
            option_quick = 1;
        }
        else if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--definition") == 0)
        {
            option_require_definition = 1;
        }
        else if (strcmp(argv[i], "--no-mmap") == 0)
        {
            option_use_mmap = 0;
        }
        else if (strcmp(argv[i], "-") == 0 && i == argc - 1)
        {
            option_stdin = 1;
            break;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are files */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    /* The codacheck program should never navigate beyond the array bounds.
     * We therefore disable to boundary check option to increase performance.
     * Mind that this option does not influence the out-of-bounds check that CODA performs to ensure
     * that a read is performed using a byte offset/size that is within the limits of the total file size.
     */
    coda_set_option_perform_boundary_checks(0);

    /* We disable conversions since this speeds up the check of reading all numerical data */
    coda_set_option_perform_conversions(0);

    /* Set mmap based on the chosen option */
    coda_set_option_use_mmap(option_use_mmap);

    if (option_stdin)
    {
        char filename[1000];
        char c;

        do
        {
            int k;

            k = 0;
            for (;;)
            {
                c = getchar();
                if (c == '\r')
                {
                    char c2;

                    c2 = getchar();
                    /* test for '\r\n' combination */
                    if (c2 != '\n')
                    {
                        /* if the second char is not '\n' put it back in the read buffer */
                        ungetc(c2, stdin);
                    }
                }
                if (c == EOF || c == '\n' || c == '\r')
                {
                    filename[k] = '\0';
                    break;
                }
                filename[k] = c;
                k++;
                assert(k < 1000);
            }
            if (k > 0)
            {
                check_file(filename);
                fflush(NULL);
            }
        } while (c != EOF);
    }
    else
    {
        while (i < argc)
        {
            check_file(argv[i]);
            fflush(NULL);
            i++;
        }
    }

    coda_done();

    if (found_errors)
    {
        exit(1);
    }

    return 0;
}